

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void AccessibilityCheckNode(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  int *piVar2;
  char cVar3;
  Dict *pDVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Bool BVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  TidyAttrId TVar15;
  int iVar16;
  TidyTagId TVar17;
  ctmbstr ptVar18;
  char *pcVar19;
  AttVal *pAVar20;
  Node *pNVar21;
  long lVar22;
  uint maxExt;
  uint maxExt_00;
  Node *pNVar23;
  ctmbstr url;
  Node **ppNVar24;
  uint uVar25;
  Node *pNVar26;
  Node *node_00;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  Node *para;
  tmbstr ptVar30;
  tmbchar *pString;
  bool bVar31;
  tmbchar local_68 [32];
  tmbchar ext [20];
  
  pNVar26 = node;
  if ((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) {
    TVar17 = node->tag->id;
    switch(TVar17) {
    case TidyTag_IFRAME:
      if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
      pAVar20 = prvTidyAttrGetById(node,TidyAttr_SRC);
      BVar11 = hasValue(pAVar20);
      if ((BVar11 == no) || (BVar11 = IsValidSrcExtension(pAVar20->value), BVar11 != no))
      goto switchD_00139e96_caseD_3f;
      uVar12 = 0x2d3;
      break;
    case TidyTag_ILAYER:
    case TidyTag_INS:
    case TidyTag_ISINDEX:
    case TidyTag_KBD:
    case TidyTag_KEYGEN:
      goto switchD_00138e80_caseD_33;
    case TidyTag_IMG:
      CheckFlicker(doc,node);
      CheckColorAvailable(doc,node);
      if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
      pAVar20 = (AttVal *)&node->attributes;
      bVar7 = false;
      bVar9 = false;
      bVar5 = false;
      bVar31 = false;
      bVar10 = false;
      bVar6 = false;
LAB_001392e9:
      bVar8 = bVar6;
      pAVar20 = pAVar20->next;
      if (pAVar20 != (AttVal *)0x0) {
        bVar6 = bVar8;
        if (pAVar20->dict != (Attribute *)0x0) {
          TVar15 = pAVar20->dict->id;
          if (TVar15 == TidyAttr_WIDTH) {
            BVar11 = hasValue(pAVar20);
            if (BVar11 != no) {
              iVar16 = atoi(pAVar20->value);
              if (iVar16 < 0x1e) {
                bVar5 = true;
              }
              if (0x96 < iVar16) {
                bVar31 = true;
              }
            }
          }
          else if (TVar15 == TidyAttr_HEIGHT) {
            BVar11 = hasValue(pAVar20);
            if ((BVar11 != no) && (iVar16 = atoi(pAVar20->value), iVar16 < 0x1e)) {
              bVar9 = true;
            }
          }
          else if (TVar15 == TidyAttr_LONGDESC) {
            BVar11 = hasValue(pAVar20);
            if ((BVar11 != no) && (uVar12 = prvTidytmbstrlen(pAVar20->value), 1 < uVar12)) {
              bVar7 = true;
            }
          }
          else if (TVar15 == TidyAttr_USEMAP) {
            BVar11 = hasValue(pAVar20);
            if (BVar11 != no) {
              (doc->access).HasUseMap = yes;
            }
          }
          else if (TVar15 == TidyAttr_ALT) {
            if (pAVar20->value != (ctmbstr)0x0) {
              uVar12 = prvTidytmbstrlen(pAVar20->value);
              ptVar18 = pAVar20->value;
              if (((uVar12 < 0x96) && (BVar11 = IsPlaceholderAlt(ptVar18), BVar11 == no)) &&
                 (pcVar19 = strstr(ptVar18,"object"), pcVar19 == (char *)0x0)) {
                BVar11 = EndsWithBytes(ptVar18);
                ptVar18 = pAVar20->value;
                if (BVar11 == no) {
                  BVar11 = IsImage(ptVar18);
                  bVar6 = true;
                  if (BVar11 == no) goto LAB_001392e9;
                  ptVar18 = pAVar20->value;
                }
              }
              uVar12 = prvTidytmbstrlen(ptVar18);
              if (uVar12 < 0x97) {
                BVar11 = IsImage(pAVar20->value);
                if (BVar11 == no) {
                  ptVar18 = pAVar20->value;
                  BVar11 = IsPlaceholderAlt(ptVar18);
                  if (BVar11 != no) {
                    uVar12 = 0x297;
                    goto LAB_001393be;
                  }
                  BVar11 = EndsWithBytes(ptVar18);
                  bVar6 = bVar8;
                  if (BVar11 == no) goto LAB_001392e9;
                  uVar12 = 0x296;
                }
                else {
                  uVar12 = 0x295;
                }
                prvTidyReportAccessError(doc,node,uVar12);
                bVar6 = true;
                goto LAB_001392e9;
              }
              uVar12 = 0x298;
LAB_001393be:
              prvTidyReportAccessError(doc,node,uVar12);
              bVar6 = true;
            }
          }
          else if (TVar15 == TidyAttr_ISMAP) {
            bVar10 = true;
          }
        }
        goto LAB_001392e9;
      }
      pNVar21 = node->next;
      bVar6 = false;
      if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
         ((pNVar21->tag->id == TidyTag_A &&
          ((pNVar23 = pNVar21->content, pNVar26 = pNVar21, pNVar23 != (Node *)0x0 &&
           (pNVar23->tag == (Dict *)0x0)))))) {
        ptVar18 = textFromOneNode(doc,pNVar23);
        iVar16 = prvTidytmbstrcmp(ptVar18,"d");
        if ((iVar16 == 0) || (iVar16 = prvTidytmbstrcmp(ptVar18,"D"), bVar6 = false, iVar16 == 0)) {
          bVar6 = true;
        }
      }
      pNVar21 = pNVar26->next;
      if ((((((pNVar21 != (Node *)0x0) && (pNVar21->tag == (Dict *)0x0)) &&
            (pNVar23 = pNVar21->next, pNVar26 = pNVar21, pNVar23 != (Node *)0x0)) &&
           ((pNVar23->tag != (Dict *)0x0 && (pNVar23->tag->id == TidyTag_A)))) &&
          (pNVar21 = pNVar23->content, pNVar26 = pNVar23, pNVar21 != (Node *)0x0)) &&
         (pNVar21->tag == (Dict *)0x0)) {
        ptVar18 = textFromOneNode(doc,pNVar21);
        iVar16 = prvTidytmbstrcmp(ptVar18,"d");
        if ((iVar16 == 0) || (iVar16 = prvTidytmbstrcmp(ptVar18,"D"), iVar16 == 0)) {
          bVar6 = true;
        }
      }
      if (!bVar8) {
        prvTidyReportAccessError(doc,pNVar26,0x294);
      }
      if (((bVar7) || (!bVar9)) || (!bVar31 && !bVar5)) {
        uVar12 = 0x29b;
        if ((bVar6 && !bVar7) || (uVar12 = 0x29a, bVar7 && !bVar6)) {
          prvTidyReportAccessError(doc,pNVar26,uVar12);
        }
        if (!bVar6 && !bVar7) {
          prvTidyReportAccessError(doc,pNVar26,0x299);
        }
      }
      if (!bVar10) goto switchD_00139e96_caseD_3f;
      prvTidyReportAccessError(doc,pNVar26,0x2eb);
      uVar12 = 0x2a9;
      break;
    case TidyTag_INPUT:
      CheckColorAvailable(doc,node);
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
        pAVar20 = (AttVal *)&node->attributes;
        while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
          if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ID)) &&
             (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            (doc->access).HasValidId = yes;
          }
        }
        iVar16 = (doc->access).ForID + 1;
        (doc->access).ForID = iVar16;
        if (iVar16 == 2) {
          (doc->access).ForID = 0;
          CheckFormControls(doc,node);
        }
      }
      pAVar20 = (AttVal *)&node->attributes;
      bVar5 = false;
      bVar31 = false;
LAB_00139f92:
      do {
        pAVar20 = pAVar20->next;
        if (pAVar20 == (AttVal *)0x0) goto LAB_0013a002;
        if (pAVar20->dict != (Attribute *)0x0) {
          TVar15 = pAVar20->dict->id;
          if (TVar15 == TidyAttr_TYPE) {
            BVar11 = hasValue(pAVar20);
            if (((BVar11 != no) && (0xfffffffc < (doc->access).PRIORITYCHK - 4U)) &&
               ((pAVar20->value != (ctmbstr)0x0 &&
                (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"image"), iVar16 == 0)))) {
              bVar31 = true;
            }
            if (pAVar20->dict == (Attribute *)0x0) goto LAB_00139f92;
            TVar15 = pAVar20->dict->id;
          }
          if ((TVar15 == TidyAttr_ALT) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            bVar5 = true;
          }
        }
      } while( true );
    case TidyTag_LABEL:
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
        pAVar20 = prvTidyAttrGetById(node,TidyAttr_FOR);
        BVar11 = hasValue(pAVar20);
        if (BVar11 != no) {
          (doc->access).HasValidFor = yes;
        }
        iVar16 = (doc->access).ForID + 1;
        (doc->access).ForID = iVar16;
        if (iVar16 == 2) {
          (doc->access).ForID = 0;
          CheckFormControls(doc,node);
        }
      }
      goto switchD_00139e96_caseD_3f;
    default:
      if (TVar17 == TidyTag_A) {
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
LAB_00139a80:
        pAVar20 = pAVar20->next;
        uVar25 = (doc->access).PRIORITYCHK;
        if (pAVar20 != (AttVal *)0x0) {
          if ((((0xfffffffc < uVar25 - 4) && (pAVar20->dict != (Attribute *)0x0)) &&
              (pAVar20->dict->id == TidyAttr_HREF)) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            GetFileExtension(pAVar20->value,local_68,maxExt);
            BVar11 = IsValidMediaExtension(pAVar20->value);
            if (BVar11 != no) {
              prvTidyReportAccessError(doc,node,0x2aa);
            }
            uVar12 = prvTidytmbstrlen(local_68);
            if ((uVar12 < 6) && (uVar12 = prvTidytmbstrlen(local_68), uVar12 != 0)) {
              ptVar18 = pAVar20->value;
              BVar11 = IsFilePath(ptVar18);
              if (BVar11 != no) {
                GetFileExtension(ptVar18,ext,maxExt_00);
                lVar22 = 0;
                do {
                  lVar29 = lVar22;
                  if (lVar29 == 0x18) goto LAB_00139b8e;
                  iVar16 = prvTidytmbstrcasecmp
                                     (ext,(ctmbstr)((long)&soundExtensions_rel +
                                                   (long)*(int *)((long)&soundExtensions_rel +
                                                                 lVar29)));
                  lVar22 = lVar29 + 4;
                } while (iVar16 != 0);
                uVar12 = *(uint *)((long)soundExtErrCodes + lVar29);
                pNVar21 = node->next;
                if ((pNVar21 == (Node *)0x0) || (pNVar21->tag != (Dict *)0x0)) {
                  bVar5 = !bVar31;
                  bVar31 = true;
                  if (bVar5) goto LAB_00139c46;
                }
                else {
                  ptVar18 = textFromOneNode(doc,pNVar21);
                  BVar11 = IsWhitespace(ptVar18);
                  bVar5 = !bVar31;
                  bVar31 = true;
                  if (BVar11 != no && bVar5) {
LAB_00139c46:
                    prvTidyReportAccessError(doc,node,uVar12);
                    bVar31 = false;
                  }
                }
              }
            }
          }
LAB_00139b8e:
          if ((((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) &&
               (pAVar20->dict != (Attribute *)0x0)) && (pAVar20->dict->id == TidyAttr_TARGET)) &&
             (pAVar20->value != (ctmbstr)0x0)) {
            iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_new");
            if (iVar16 == 0) {
              uVar12 = 0x2f2;
            }
            else {
              if ((pAVar20->value == (ctmbstr)0x0) ||
                 (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_blank"), iVar16 != 0))
              goto LAB_00139a80;
              uVar12 = 0x2f3;
            }
            prvTidyReportAccessError(doc,node,uVar12);
          }
          goto LAB_00139a80;
        }
        if ((uVar25 & 0xfffffffe) != 2) goto switchD_00139e96_caseD_3f;
        pNVar21 = node->content;
        if (pNVar21 != (Node *)0x0) {
          if (pNVar21->tag == (Dict *)0x0) {
            ptVar18 = textFromOneNode(doc,pNVar21);
            BVar11 = IsWhitespace(ptVar18);
            if (BVar11 == no) {
              iVar16 = prvTidytmbstrcmp(ptVar18,"more");
              iVar14 = prvTidytmbstrcmp(ptVar18,"click here");
              if (iVar14 == 0) {
                prvTidyReportAccessError(doc,node,0x307);
              }
              if ((iVar16 != 0) && (uVar12 = prvTidytmbstrlen(ptVar18), uVar12 < 6)) {
                prvTidyReportAccessError(doc,node,0x304);
              }
              uVar12 = prvTidytmbstrlen(ptVar18);
              if (0x3c < uVar12) {
                prvTidyReportAccessError(doc,node,0x306);
              }
            }
          }
          if (node->content != (Node *)0x0) goto switchD_00139e96_caseD_3f;
        }
        uVar12 = 0x305;
      }
      else if (TVar17 == TidyTag_APPLET) {
        CheckDeprecated(doc,node);
        ProgrammaticObjects(doc,node);
        DynamicContent(doc,node);
        AccessibleCompatible(doc,node);
        CheckFlicker(doc,node);
        CheckColorAvailable(doc,node);
        if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
        while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
          if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ALT)) &&
             (pAVar20->value != (tmbstr)0x0)) {
            bVar31 = true;
          }
        }
        if (bVar31) goto switchD_00139e96_caseD_3f;
        pNVar21 = node->content;
        if (pNVar21 != (Node *)0x0) {
          if (pNVar21->tag == (Dict *)0x0) {
            ptVar18 = textFromOneNode(doc,pNVar21);
            pNVar21 = node->content;
          }
          else {
            ptVar18 = (ctmbstr)0x0;
          }
          pNVar21 = pNVar21->content;
          if ((pNVar21 == (Node *)0x0) || (pNVar21->tag != (Dict *)0x0)) {
            if (ptVar18 == (ctmbstr)0x0) goto LAB_0013a733;
          }
          else {
            ptVar18 = textFromOneNode(doc,pNVar21);
          }
          BVar11 = IsWhitespace(ptVar18);
          if (BVar11 == no) goto switchD_00139e96_caseD_3f;
        }
LAB_0013a733:
        uVar12 = 0x29d;
      }
      else if (TVar17 == TidyTag_AREA) {
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
LAB_00139586:
        pAVar20 = pAVar20->next;
        uVar25 = (doc->access).PRIORITYCHK;
        if (pAVar20 != (AttVal *)0x0) {
          if (((0xfffffffc < uVar25 - 4) && (pAVar20->dict != (Attribute *)0x0)) &&
             ((pAVar20->dict->id == TidyAttr_ALT && (pAVar20->value != (tmbstr)0x0)))) {
            bVar31 = true;
          }
          if (((((uVar25 & 0xfffffffe) == 2) && (pAVar20->dict != (Attribute *)0x0)) &&
              (pAVar20->dict->id == TidyAttr_TARGET)) && (pAVar20->value != (ctmbstr)0x0)) {
            iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_new");
            if (iVar16 == 0) {
              uVar12 = 0x2f2;
            }
            else {
              if ((pAVar20->value == (ctmbstr)0x0) ||
                 (iVar16 = prvTidytmbstrcasecmp(pAVar20->value,"_blank"), iVar16 != 0))
              goto LAB_00139586;
              uVar12 = 0x2f3;
            }
            prvTidyReportAccessError(doc,node,uVar12);
          }
          goto LAB_00139586;
        }
        if ((2 < uVar25 - 1) || (bVar31)) goto switchD_00139e96_caseD_3f;
        uVar12 = 0x2a6;
      }
      else if (TVar17 == TidyTag_XMP) {
LAB_001390c7:
        uVar25 = (doc->access).PRIORITYCHK;
        if ((uVar25 - 4 < 0xfffffffd) || (pNVar21 = node->content, pNVar21 == (Node *)0x0)) {
LAB_001391a8:
          bVar31 = false;
LAB_001391ab:
          bVar5 = bVar31;
          iVar16 = 0;
          ptVar30 = (char *)0x0;
        }
        else {
          uVar28 = (ulong)(pNVar21->start + 1);
          lVar22 = 0;
          iVar16 = -1;
          uVar27 = pNVar21->start;
          do {
            uVar1 = uVar27 + 1;
            if (pNVar21->end <= uVar1) break;
            ptVar30 = doc->lexer->lexbuf;
            cVar3 = ptVar30[uVar1];
            iVar16 = iVar16 + (uint)(cVar3 == '\n');
            for (lVar22 = 0;
                (uVar28 + lVar22 < (ulong)(uVar27 + 6) && (ptVar30[lVar22 + uVar28] == cVar3));
                lVar22 = lVar22 + 1) {
            }
            uVar28 = uVar28 + 1;
            uVar27 = uVar1;
          } while ((uint)lVar22 < 5);
          if ((int)lVar22 < 5 && iVar16 < 6) goto LAB_001391a8;
          bVar5 = true;
          bVar31 = true;
          if ((node->prev == (Node *)0x0) || (pNVar21 = node->prev->prev, pNVar21 == (Node *)0x0))
          goto LAB_001391ab;
          pAVar20 = (AttVal *)&pNVar21->attributes;
          iVar16 = 0;
          ptVar30 = (tmbstr)0x0;
          while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
            if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_HREF)) &&
               (BVar11 = hasValue(pAVar20), BVar11 != no)) {
              ptVar30 = pAVar20->value;
              iVar16 = iVar16 + 1;
            }
          }
          uVar25 = (doc->access).PRIORITYCHK;
        }
        if ((uVar25 & 0xfffffffe) != 2) goto switchD_00139e96_caseD_3f;
        if (iVar16 == 1) {
          pNVar21 = node->next;
          iVar16 = 1;
          if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
             (pNVar21->tag->id == TidyTag_A)) {
            pAVar20 = (AttVal *)&pNVar21->attributes;
            iVar16 = 1;
            while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
              if (((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_NAME)) &&
                 (BVar11 = hasValue(pAVar20), BVar11 != no)) {
                pcVar19 = strstr(ptVar30,pAVar20->value);
                iVar16 = (iVar16 + 1) - (uint)(pcVar19 == (char *)0x0);
              }
            }
          }
        }
        if (((!bVar5) || (prvTidyReportAccessError(doc,node,0x2a8), (doc->access).PRIORITYCHK != 3))
           || (1 < iVar16)) goto switchD_00139e96_caseD_3f;
        uVar12 = 0x30a;
      }
      else if (TVar17 == TidyTag_FRAME) {
        piVar2 = &(doc->access).numFrames;
        *piVar2 = *piVar2 + 1;
        if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
        pAVar20 = (AttVal *)&node->attributes;
        bVar31 = false;
LAB_001396e5:
        pAVar20 = pAVar20->next;
        if (pAVar20 != (AttVal *)0x0) {
          if (pAVar20->dict != (Attribute *)0x0) {
            TVar15 = pAVar20->dict->id;
            if (TVar15 == TidyAttr_TITLE) {
              BVar11 = hasValue(pAVar20);
              if (BVar11 != no) {
                bVar31 = true;
              }
              if (!bVar31) {
                if ((pAVar20->value == (ctmbstr)0x0) ||
                   (uVar12 = prvTidytmbstrlen(pAVar20->value), uVar12 == 0)) {
                  uVar12 = 0x2ff;
                }
                else {
                  BVar11 = IsWhitespace(pAVar20->value);
                  bVar31 = false;
                  if (BVar11 == no) goto LAB_001396e5;
                  uVar12 = prvTidytmbstrlen(pAVar20->value);
                  bVar31 = false;
                  if (uVar12 == 0) goto LAB_001396e5;
                  uVar12 = 0x300;
                }
                prvTidyReportAccessError(doc,node,uVar12);
                bVar31 = true;
              }
            }
            else if (TVar15 == TidyAttr_SRC) {
              BVar11 = hasValue(pAVar20);
              if ((BVar11 != no) && (BVar11 = IsValidSrcExtension(pAVar20->value), BVar11 == no)) {
                prvTidyReportAccessError(doc,node,0x2d3);
              }
            }
            else if (((TVar15 == TidyAttr_LONGDESC) && (BVar11 = hasValue(pAVar20), BVar11 != no))
                    && (uVar12 = prvTidytmbstrlen(pAVar20->value), 1 < uVar12)) {
              piVar2 = &(doc->access).HasCheckedLongDesc;
              *piVar2 = *piVar2 + 1;
            }
          }
          goto LAB_001396e5;
        }
        if (!bVar31) {
          prvTidyReportAccessError(doc,node,0x2fe);
        }
        if (((doc->access).numFrames != 3) || (2 < (doc->access).HasCheckedLongDesc))
        goto switchD_00139e96_caseD_3f;
        (doc->access).numFrames = 0;
        uVar12 = 0x2a5;
      }
      else if (TVar17 == TidyTag_FRAMESET) {
        if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
        if ((doc->badAccess & 0x40) != 0) {
          prvTidyReportAccessError(doc,node,0x2de);
          *(byte *)&doc->badAccess = (byte)doc->badAccess & 0xbf;
        }
        bVar31 = false;
        ppNVar24 = &node->content;
        while (pNVar21 = *ppNVar24, pNVar21 != (Node *)0x0) {
          if ((pNVar21->tag == (Dict *)0x0) || (pNVar21->tag->id != TidyTag_NOFRAMES))
          goto LAB_00139e7f;
          pNVar23 = pNVar21->content;
          if (pNVar23 == (Node *)0x0) {
LAB_00139e6d:
            uVar12 = 0x2dc;
            node_00 = pNVar21;
LAB_00139e78:
            prvTidyReportAccessError(doc,node_00,uVar12);
            bVar31 = true;
          }
          else {
            node_00 = pNVar23->content;
            if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
               (node_00->tag->id != TidyTag_P)) {
              ptVar18 = textFromOneNode(doc,pNVar23);
              BVar11 = IsWhitespace(ptVar18);
              bVar31 = true;
              if (BVar11 != no) goto LAB_00139e6d;
            }
            else {
              BVar11 = prvTidynodeIsText(node_00->content);
              bVar31 = true;
              if (BVar11 != no) {
                ptVar18 = textFromOneNode(doc,node_00->content);
                pcVar19 = strstr(ptVar18,"browser");
                bVar31 = true;
                if (pcVar19 != (char *)0x0) {
                  uVar12 = 0x2dd;
                  goto LAB_00139e78;
                }
              }
            }
          }
LAB_00139e7f:
          ppNVar24 = &pNVar21->next;
        }
        if (bVar31) goto switchD_00139e96_caseD_3f;
        uVar12 = 0x2db;
      }
      else if (TVar17 == TidyTag_HEAD) {
        BVar11 = CheckMetaData(doc,node,no);
        if ((BVar11 != no) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2))
        goto switchD_00139e96_caseD_3f;
        uVar12 = 0x308;
      }
      else {
        if (TVar17 == TidyTag_MAP) {
          if ((doc->access).PRIORITYCHK == 3) {
            ppNVar24 = &node->content;
            while (pNVar26 = *ppNVar24, pNVar26 != (Node *)0x0) {
              if ((pNVar26->tag != (Dict *)0x0) && (pNVar26->tag->id == TidyTag_AREA)) {
                pAVar20 = prvTidyAttrGetById(pNVar26,TidyAttr_HREF);
                BVar11 = hasValue(pAVar20);
                if ((BVar11 != no) &&
                   (BVar11 = FindLinkA(doc,(Node *)pAVar20->value,url), BVar11 == no)) {
                  prvTidyReportAccessError(doc,node,0x2ab);
                }
              }
              ppNVar24 = &pNVar26->next;
            }
          }
          goto switchD_00139e96_caseD_3f;
        }
        if (TVar17 == TidyTag_OBJECT) {
          ProgrammaticObjects(doc,node);
          DynamicContent(doc,node);
          AccessibleCompatible(doc,node);
          CheckFlicker(doc,node);
          CheckColorAvailable(doc,node);
          if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto switchD_00139e96_caseD_3f;
          pNVar21 = node->content;
          if (pNVar21 != (Node *)0x0) {
            if (pNVar21->type != TextNode) {
              pAVar20 = (AttVal *)&pNVar21->attributes;
              do {
                pAVar20 = pAVar20->next;
                if (pAVar20 == (AttVal *)0x0) goto LAB_00139a1b;
              } while ((pAVar20->dict == (Attribute *)0x0) || (pAVar20->dict->id != TidyAttr_ALT));
              goto switchD_00139e96_caseD_3f;
            }
LAB_00139a1b:
            BVar11 = prvTidynodeIsText(pNVar21);
            pNVar21 = node->content;
            if (BVar11 == no) {
              BVar11 = prvTidynodeIsText(pNVar21->content);
              if (BVar11 == no) goto LAB_00139a55;
              pNVar21 = node->content->content;
            }
            ptVar18 = textFromOneNode(doc,pNVar21);
            BVar11 = IsWhitespace(ptVar18);
            if (BVar11 == no) goto switchD_00139e96_caseD_3f;
          }
LAB_00139a55:
          uVar12 = 0x29e;
        }
        else {
          if (TVar17 == TidyTag_PRE) goto LAB_001390c7;
          if (TVar17 == TidyTag_SCRIPT) {
            DynamicContent(doc,node);
            ProgrammaticObjects(doc,node);
            AccessibleCompatible(doc,node);
            CheckFlicker(doc,node);
            CheckColorAvailable(doc,node);
            if (((doc->access).PRIORITYCHK - 4U < 0xfffffffd) ||
               (((node->next != (Node *)0x0 && (pDVar4 = node->next->tag, pDVar4 != (Dict *)0x0)) &&
                (pDVar4->id == TidyTag_NOSCRIPT)))) goto switchD_00139e96_caseD_3f;
            uVar12 = 0x2a7;
          }
          else {
            if (TVar17 != TidyTag_TABLE) {
              if (TVar17 == TidyTag_BODY) {
                CheckColorContrast(doc,node);
                goto switchD_00139e96_caseD_3f;
              }
              goto switchD_00138e80_caseD_33;
            }
            CheckColorContrast(doc,node);
            iVar16 = (doc->access).PRIORITYCHK;
            bVar31 = true;
            if (iVar16 == 3) {
              pAVar20 = (AttVal *)&node->attributes;
              bVar31 = false;
LAB_00139802:
              pAVar20 = pAVar20->next;
              if (pAVar20 != (AttVal *)0x0) {
                if ((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_SUMMARY))
                {
                  BVar11 = hasValue(pAVar20);
                  if (BVar11 != no) {
                    bVar31 = true;
                    if (pAVar20->value != (ctmbstr)0x0) {
                      ptVar18 = prvTidytmbsubstr(pAVar20->value,"summary");
                      bVar31 = true;
                      if (ptVar18 != (ctmbstr)0x0) {
                        bVar31 = true;
                        if (pAVar20->value != (ctmbstr)0x0) {
                          ptVar18 = prvTidytmbsubstr(pAVar20->value,"table");
                          bVar31 = true;
                          if (ptVar18 != (ctmbstr)0x0) {
                            prvTidyReportAccessError(doc,node,0x2cb);
                            bVar31 = true;
                          }
                        }
                      }
                    }
                  }
                  uVar12 = 0x2c9;
                  if ((pAVar20->value != (ctmbstr)0x0) &&
                     (uVar13 = prvTidytmbstrlen(pAVar20->value), uVar13 != 0)) {
                    BVar11 = IsWhitespace(pAVar20->value);
                    if (BVar11 == no) goto LAB_00139802;
                    uVar13 = prvTidytmbstrlen(pAVar20->value);
                    uVar12 = 0x2ca;
                    if (uVar13 == 0) goto LAB_00139802;
                  }
                  prvTidyReportAccessError(doc,node,uVar12);
                  bVar31 = true;
                }
                goto LAB_00139802;
              }
              if (node->content == (Node *)0x0) {
                uVar12 = 0x2c1;
                break;
              }
              iVar16 = (doc->access).PRIORITYCHK;
              bVar31 = !bVar31;
            }
            if ((0xfffffffc < iVar16 - 4U) && (pNVar21 = node->content, pNVar21 != (Node *)0x0)) {
              bVar5 = true;
              bVar7 = true;
              for (; pNVar21 != (Node *)0x0; pNVar21 = pNVar21->next) {
                if (((pNVar21->tag != (Dict *)0x0) && (pNVar21->tag->id == TidyTag_TR)) &&
                   (pNVar23 = pNVar21->content, pNVar23 != (Node *)0x0)) {
                  for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                    if ((pNVar23->tag != (Dict *)0x0) && (pNVar23->tag->id == TidyTag_TH)) {
                      pAVar20 = (AttVal *)&pNVar23->attributes;
                      while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
                        if (pAVar20->dict != (Attribute *)0x0) {
                          TVar15 = pAVar20->dict->id;
                          if (TVar15 == TidyAttr_ROWSPAN) {
                            iVar16 = atoi(pAVar20->value);
                            if (1 < iVar16) {
                              bVar5 = false;
                            }
                          }
                          else if ((TVar15 == TidyAttr_COLSPAN) &&
                                  (iVar16 = atoi(pAVar20->value), 1 < iVar16)) {
                            bVar7 = false;
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (!bVar5) {
                prvTidyReportAccessError(doc,node,0x2c5);
                prvTidyDialogue(doc,0x20a);
              }
              if (!bVar7) {
                prvTidyReportAccessError(doc,node,0x2c4);
                prvTidyDialogue(doc,0x20a);
              }
            }
            if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
              pNVar21 = node->content;
              if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
                 (pNVar21->tag->id == TidyTag_CAPTION)) {
                if ((pNVar21->content == (Node *)0x0) || (pNVar21->content->tag != (Dict *)0x0)) {
                  pString = (tmbchar *)0x0;
                }
                else {
                  pString = (doc->access).textNode;
                  memset(&(doc->access).counter,0,0x84);
                  getTextNode(doc,pNVar21->content);
                }
                BVar11 = IsWhitespace(pString);
                if (BVar11 == no) goto LAB_0013a801;
              }
              prvTidyReportAccessError(doc,node,0x2cc);
            }
LAB_0013a801:
            pNVar21 = node->content;
            if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
               ((TVar17 = pNVar21->tag->id, TVar17 == TidyTag_TR ||
                ((((TVar17 == TidyTag_CAPTION && (pNVar21 = pNVar21->next, pNVar21 != (Node *)0x0))
                  && (pNVar21->tag != (Dict *)0x0)) && (pNVar21->tag->id == TidyTag_TR)))))) {
              piVar2 = &(doc->access).CheckedHeaders;
              *piVar2 = *piVar2 + 1;
              pNVar21 = pNVar21->content;
              if (((pNVar21 != (Node *)0x0) && (pNVar21->tag != (Dict *)0x0)) &&
                 (pNVar21->tag->id == TidyTag_TH)) {
                (doc->access).HasTH = yes;
                iVar16 = 0;
                bVar5 = false;
                for (; pNVar21 != (Node *)0x0; pNVar21 = pNVar21->next) {
                  if ((pNVar21->tag == (Dict *)0x0) || (pNVar21->tag->id != TidyTag_TH)) {
                    bVar5 = true;
                  }
                  else {
                    BVar11 = prvTidynodeIsText(pNVar21->content);
                    if (BVar11 != no) {
                      ptVar18 = textFromOneNode(doc,pNVar21->content);
                      BVar11 = IsWhitespace(ptVar18);
                      iVar16 = iVar16 + (uint)(BVar11 == no);
                    }
                  }
                }
                if (((!bVar5) && (lVar22 = 0x3378, 0 < iVar16)) ||
                   ((bVar5 && (lVar22 = 0x3380, 1 < iVar16)))) {
                  *(undefined4 *)((long)(doc->config).value + lVar22 + -0x70) = 1;
                }
              }
            }
            if (((((doc->access).HasValidColumnHeaders == no) &&
                 (pNVar21 = node->content, pNVar21 != (Node *)0x0)) && (pNVar21->tag != (Dict *)0x0)
                ) && ((TVar17 = pNVar21->tag->id, TVar17 == TidyTag_TR ||
                      (((TVar17 == TidyTag_CAPTION &&
                        (pNVar21 = pNVar21->next, pNVar21 != (Node *)0x0)) &&
                       ((pNVar21->tag != (Dict *)0x0 && (pNVar21->tag->id == TidyTag_TR)))))))) {
              piVar2 = &(doc->access).CheckedHeaders;
              *piVar2 = *piVar2 + 1;
              uVar27 = 0;
              uVar25 = 0;
              for (; pNVar21 != (Node *)0x0; pNVar21 = pNVar21->next) {
                pNVar23 = pNVar21->content;
                if (((pNVar23 != (Node *)0x0) && (pNVar23->tag != (Dict *)0x0)) &&
                   (pNVar23->tag->id == TidyTag_TH)) {
                  (doc->access).HasTH = yes;
                  BVar11 = prvTidynodeIsText(pNVar23->content);
                  if (BVar11 != no) {
                    ptVar18 = textFromOneNode(doc,pNVar21->content->content);
                    BVar11 = IsWhitespace(ptVar18);
                    uVar25 = uVar25 + (BVar11 == no);
                  }
                }
                uVar27 = uVar27 + 1;
              }
              if (uVar27 == uVar25) {
                (doc->access).HasValidRowHeaders = yes;
              }
              if (((1 < uVar27) && (1 < (int)uVar25 && (int)uVar25 < (int)uVar27)) &&
                 ((doc->access).HasTH == yes)) {
                (doc->access).HasInvalidRowHeader = yes;
              }
            }
            uVar25 = (doc->access).PRIORITYCHK;
            if ((bool)(uVar25 == 3 & bVar31)) {
              prvTidyReportAccessError(doc,node,0x2c8);
              uVar25 = (doc->access).PRIORITYCHK;
            }
            if ((uVar25 & 0xfffffffe) == 2) {
              pNVar21 = node->content;
              if (pNVar21 != (Node *)0x0) {
                iVar16 = 0;
                for (; pNVar21 != (Node *)0x0; pNVar21 = pNVar21->next) {
                  if (pNVar21->tag != (Dict *)0x0) {
                    iVar16 = iVar16 + (uint)(pNVar21->tag->id == TidyTag_TR);
                  }
                }
                if (iVar16 == 1) {
                  prvTidyReportAccessError(doc,node,0x2c6);
                }
              }
              if ((doc->access).HasTH != no) {
                prvTidyReportAccessError(doc,node,0x2c7);
              }
            }
            if (((doc->access).PRIORITYCHK - 4U < 0xfffffffd) || ((doc->access).CheckedHeaders != 2)
               ) goto switchD_00139e96_caseD_3f;
            if (((doc->access).HasValidRowHeaders == no) &&
               (((((doc->access).HasValidColumnHeaders != no ||
                  ((doc->access).HasInvalidRowHeader != no)) ||
                 (((doc->access).HasInvalidColumnHeader != no ||
                  (prvTidyReportAccessError(doc,node,0x2c1), (doc->access).HasValidRowHeaders == no)
                  ))) && ((doc->access).HasInvalidRowHeader != no)))) {
              prvTidyReportAccessError(doc,node,0x2c3);
            }
            if (((doc->access).HasValidColumnHeaders != no) ||
               ((doc->access).HasInvalidColumnHeader == no)) goto switchD_00139e96_caseD_3f;
            uVar12 = 0x2c2;
          }
        }
      }
    }
    goto LAB_00139096;
  }
switchD_00138e80_caseD_33:
  BVar11 = prvTidynodeIsHeader(node);
  if (BVar11 != no) {
    if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto switchD_00139e96_caseD_3f;
    pNVar21 = node->content;
    bVar31 = true;
    if ((pNVar21 != (Node *)0x0) && (pNVar21->tag == (Dict *)0x0)) {
      ptVar18 = textFromOneNode(doc,pNVar21);
      uVar25 = 1;
      for (uVar28 = 0; uVar12 = prvTidytmbstrlen(ptVar18), uVar28 < uVar12; uVar28 = uVar28 + 1) {
        uVar25 = uVar25 + (ptVar18[uVar28] == ' ');
      }
      bVar31 = uVar25 < 0x15;
    }
    BVar11 = prvTidynodeIsHeader(node);
    if (BVar11 == no) {
LAB_00139076:
      prvTidyReportAccessError(doc,node,0x2b7);
    }
    else {
      uVar12 = prvTidynodeHeaderLevel(node);
      pNVar21 = node;
      do {
        pNVar21 = pNVar21->next;
        if (pNVar21 == (Node *)0x0) goto LAB_00139086;
        uVar13 = prvTidynodeHeaderLevel(pNVar21);
      } while (uVar13 < uVar12);
      if (uVar12 + 1 < uVar13) goto LAB_00139076;
    }
LAB_00139086:
    if (bVar31) goto switchD_00139e96_caseD_3f;
    uVar12 = 699;
    goto LAB_00139096;
  }
  if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) goto switchD_00139e96_caseD_3f;
  TVar17 = node->tag->id;
  switch(TVar17) {
  case TidyTag_LI:
switchD_00139e96_caseD_3d:
    if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
    if (TVar17 == TidyTag_LI) {
      uVar12 = 0x2be;
      if (((node->parent != (Node *)0x0) && (pDVar4 = node->parent->tag, pDVar4 != (Dict *)0x0)) &&
         ((TVar17 = pDVar4->id, TVar17 == TidyTag_UL || (TVar17 == TidyTag_OL)))) {
        if (node->implicit == no) break;
        uVar12 = TVar17 == TidyTag_UL ^ 0x2bd;
      }
    }
    else {
      if (TVar17 == TidyTag_OL) {
        uVar12 = 0x2bd;
      }
      else {
        if (TVar17 != TidyTag_UL) break;
        uVar12 = 700;
      }
      if ((((node->content != (Node *)0x0) && (pDVar4 = node->content->tag, pDVar4 != (Dict *)0x0))
          && (pDVar4->id == TidyTag_LI)) && (uVar12 = 0x2be, node->implicit == no)) break;
    }
    goto LAB_00139096;
  case TidyTag_LINK:
    if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
      pAVar20 = (AttVal *)&node->attributes;
      bVar31 = false;
      bVar5 = false;
LAB_0013a304:
      do {
        pAVar20 = pAVar20->next;
        if (pAVar20 == (AttVal *)0x0) goto LAB_0013a56f;
        if (pAVar20->dict != (Attribute *)0x0) {
          TVar15 = pAVar20->dict->id;
          if (TVar15 == TidyAttr_REL) {
            BVar11 = hasValue(pAVar20);
            if (((BVar11 != no) && (pAVar20->value != (ctmbstr)0x0)) &&
               (ptVar18 = prvTidytmbsubstr(pAVar20->value,"stylesheet"), ptVar18 != (ctmbstr)0x0)) {
              bVar31 = true;
            }
            if (pAVar20->dict == (Attribute *)0x0) goto LAB_0013a304;
            TVar15 = pAVar20->dict->id;
          }
          if ((TVar15 == TidyAttr_TYPE) && (BVar11 = hasValue(pAVar20), BVar11 != no)) {
            bVar5 = true;
          }
        }
      } while( true );
    }
    break;
  case TidyTag_LISTING:
  case TidyTag_MAP:
  case TidyTag_MATHML:
    break;
  case TidyTag_MARQUEE:
    pNVar21 = node;
    if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
LAB_0013a41d:
    BVar11 = prvTidynodeIsText(pNVar21);
    if (BVar11 == no) break;
    ptVar18 = textFromOneNode(doc,node->content);
    BVar11 = IsWhitespace(ptVar18);
    if (BVar11 != no) break;
    uVar12 = 0x2e4;
    goto LAB_00139096;
  default:
    if (TVar17 != TidyTag_BASEFONT) {
      if (TVar17 == TidyTag_BLINK) {
        if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) break;
        pNVar21 = node->content;
        goto LAB_0013a41d;
      }
      if ((TVar17 != TidyTag_CENTER) && (TVar17 != TidyTag_DIR)) {
        if (TVar17 == TidyTag_EMBED) {
          if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
            pAVar20 = prvTidyAttrGetById(node,TidyAttr_SRC);
            BVar11 = hasValue(pAVar20);
            if ((BVar11 != no) && (BVar11 = IsValidMediaExtension(pAVar20->value), BVar11 != no)) {
              prvTidyReportAccessError(doc,node,0x2aa);
            }
          }
          ProgrammaticObjects(doc,node);
          AccessibleCompatible(doc,node);
          CheckFlicker(doc,node);
          break;
        }
        if (TVar17 != TidyTag_FONT) {
          if (TVar17 == TidyTag_HTML) {
            if ((doc->access).PRIORITYCHK != 3) break;
            pAVar20 = prvTidyAttrGetById(node,TidyAttr_LANG);
            if (pAVar20 == (AttVal *)0x0) {
              uVar12 = 0x2bf;
            }
            else {
              BVar11 = hasValue(pAVar20);
              if (BVar11 != no) break;
              uVar12 = 0x2c0;
            }
            goto LAB_00139096;
          }
          if (TVar17 != TidyTag_ISINDEX) {
            if ((TVar17 == TidyTag_OL) || (TVar17 == TidyTag_UL)) goto switchD_00139e96_caseD_3d;
            if ((TVar17 != TidyTag_S) && (TVar17 != TidyTag_STRIKE)) {
              if (TVar17 == TidyTag_STYLE) {
                CheckColorContrast(doc,node);
                if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) break;
                uVar12 = 0x2d1;
              }
              else if (TVar17 == TidyTag_TH) {
                if ((doc->access).PRIORITYCHK != 3) break;
                pAVar20 = (AttVal *)&node->attributes;
                bVar31 = false;
                while (pAVar20 = pAVar20->next, pAVar20 != (AttVal *)0x0) {
                  if ((pAVar20->dict != (Attribute *)0x0) && (pAVar20->dict->id == TidyAttr_ABBR)) {
                    if (pAVar20->value == (ctmbstr)0x0) {
LAB_0013a4ae:
                      prvTidyReportAccessError(doc,node,0x2ce);
                      bVar31 = true;
                    }
                    else {
                      BVar11 = IsWhitespace(pAVar20->value);
                      if (pAVar20->value == (ctmbstr)0x0) goto LAB_0013a4ae;
                      if (BVar11 == no) {
                        bVar31 = true;
                      }
                      uVar12 = prvTidytmbstrlen(pAVar20->value);
                      if (uVar12 == 0) goto LAB_0013a4ae;
                    }
                    BVar11 = IsWhitespace(pAVar20->value);
                    if ((BVar11 == yes) && (uVar12 = prvTidytmbstrlen(pAVar20->value), uVar12 != 0))
                    {
                      prvTidyReportAccessError(doc,node,0x2cf);
                      bVar31 = true;
                    }
                  }
                }
                ptVar18 = textFromOneNode(doc,node->content);
                BVar11 = IsWhitespace(ptVar18);
                if (((BVar11 != no) || (uVar12 = prvTidytmbstrlen(ptVar18), uVar12 < 0x10)) ||
                   (bVar31)) break;
                uVar12 = 0x2cd;
              }
              else {
                if (TVar17 == TidyTag_U) goto switchD_00139e96_caseD_43;
                if (((TVar17 != TidyTag_P) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2)) ||
                   ((pNVar21 = node->content, pNVar21 == (Node *)0x0 ||
                    (pNVar23 = pNVar21, pNVar21->tag == (Dict *)0x0)))) break;
                for (; pNVar23 != (Node *)0x0; pNVar23 = pNVar23->next) {
                  if (pNVar23->tag == (Dict *)0x0) goto switchD_00139e96_caseD_3f;
                }
                if (pNVar21->tag->id == TidyTag_STRONG) {
                  prvTidyReportAccessError(doc,node,0x2b8);
                  pNVar21 = node->content;
                }
                if ((pNVar21 == (Node *)0x0) || (pNVar21->tag == (Dict *)0x0)) break;
                TVar17 = pNVar21->tag->id;
                if (TVar17 == TidyTag_U) {
                  prvTidyReportAccessError(doc,node,0x2ba);
                  if ((node->content == (Node *)0x0) ||
                     (pDVar4 = node->content->tag, pDVar4 == (Dict *)0x0)) break;
                  TVar17 = pDVar4->id;
                }
                if (TVar17 != TidyTag_EM) break;
                uVar12 = 0x2b9;
              }
              goto LAB_00139096;
            }
          }
        }
      }
    }
  case TidyTag_MENU:
switchD_00139e96_caseD_43:
    CheckDeprecated(doc,node);
  }
  goto switchD_00139e96_caseD_3f;
LAB_0013a002:
  if ((!bVar31) || (bVar5)) goto switchD_00139e96_caseD_3f;
  uVar12 = 0x29c;
  goto LAB_00139096;
LAB_0013a56f:
  if ((!bVar31) || (!bVar5)) goto switchD_00139e96_caseD_3f;
  uVar12 = 0x2d0;
LAB_00139096:
  prvTidyReportAccessError(doc,pNVar26,uVar12);
switchD_00139e96_caseD_3f:
  ppNVar24 = &node->content;
  while (pNVar26 = *ppNVar24, pNVar26 != (Node *)0x0) {
    AccessibilityCheckNode(doc,pNVar26);
    ppNVar24 = &pNVar26->next;
  }
  return;
}

Assistant:

static void AccessibilityCheckNode( TidyDocImpl* doc, Node* node )
{
    Node* content;
    
    /* Check BODY for color contrast */
    if ( nodeIsBODY(node) )
    {
        CheckColorContrast( doc, node );
    }

    /* Checks document for MetaData */
    else if ( nodeIsHEAD(node) )
    {
        if ( !CheckMetaData( doc, node, no ) )
          MetaDataPresent( doc, node );
    }
    
    /* Check the ANCHOR tag */
    else if ( nodeIsA(node) )
    {
        CheckAnchorAccess( doc, node );
    }

    /* Check the IMAGE tag */
    else if ( nodeIsIMG(node) )
    {
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckImage( doc, node );
    }

        /* Checks MAP for client-side text links */
    else if ( nodeIsMAP(node) )
    {
        CheckMapLinks( doc, node );
    }

    /* Check the AREA tag */
    else if ( nodeIsAREA(node) )
    {
        CheckArea( doc, node );
    }

    /* Check the APPLET tag */
    else if ( nodeIsAPPLET(node) )
    {
        CheckDeprecated( doc, node );
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckApplet(doc, node );
    }
    
    /* Check the OBJECT tag */
    else if ( nodeIsOBJECT(node) )
    {
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckObject( doc, node );
    }
    
    /* Check the FRAME tag */
    else if ( nodeIsFRAME(node) )
    {
        CheckFrame( doc, node );
    }
    
    /* Check the IFRAME tag */
    else if ( nodeIsIFRAME(node) )
    {
        CheckIFrame( doc, node );
    }
    
    /* Check the SCRIPT tag */
    else if ( nodeIsSCRIPT(node) )
    {
        DynamicContent( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckScriptAcc( doc, node );
    }

    /* Check the TABLE tag */
    else if ( nodeIsTABLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckTable( doc, node );
    }

    /* Check the PRE for ASCII art */
    else if ( nodeIsPRE(node) || nodeIsXMP(node) )
    {
        CheckASCII( doc, node );
    }

    /* Check the LABEL tag */
    else if ( nodeIsLABEL(node) )
    {
        CheckLabel( doc, node );
    }

    /* Check INPUT tag for validity */
    else if ( nodeIsINPUT(node) )
    {
        CheckColorAvailable( doc, node );
        CheckInputLabel( doc, node );
        CheckInputAttributes( doc, node );
    }

    /* Checks FRAMESET element for NOFRAME section */
    else if ( nodeIsFRAMESET(node) )
    {
        CheckFrameSet( doc, node );
    }
    
    /* Checks for header elements for valid header increase */
    else if ( TY_(nodeIsHeader)(node) )
    {
        CheckHeaderNesting( doc, node );
    }

    /* Checks P element to ensure that it is not a header */
    else if ( nodeIsP(node) )
    {
        CheckParagraphHeader( doc, node );
    }

    /* Checks HTML elemnt for valid 'LANG' */
    else if ( nodeIsHTML(node) )
    {
        CheckHTMLAccess( doc, node );
    }

    /* Checks BLINK for any blinking text */
    else if ( nodeIsBLINK(node) )
    {
        CheckBlink( doc, node );
    }

    /* Checks MARQUEE for any MARQUEE text */
    else if ( nodeIsMARQUEE(node) )
    {
        CheckMarquee( doc, node );
    }

    /* Checks LINK for 'REL' attribute */
    else if ( nodeIsLINK(node) )
    {
        CheckLink( doc, node );
    }

    /* Checks to see if STYLE is used */
    else if ( nodeIsSTYLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckStyle( doc, node );
    }

    /* Checks to see if EMBED is used */
    else if ( nodeIsEMBED(node) )
    {
        CheckEmbed( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
    }

    /* Deprecated HTML if the following tags are found in the document */
    else if ( nodeIsBASEFONT(node) ||
              nodeIsCENTER(node)   ||
              nodeIsISINDEX(node)  ||
              nodeIsU(node)        ||
              nodeIsFONT(node)     ||
              nodeIsDIR(node)      ||
              nodeIsS(node)        ||
              nodeIsSTRIKE(node)   ||
              nodeIsMENU(node) )
    {
        CheckDeprecated( doc, node );
    }

    /* Checks for 'ABBR' attribute if needed */
    else if ( nodeIsTH(node) )
    {
        CheckTH( doc, node );
    }

    /* Ensures that lists are properly used */
    else if ( nodeIsLI(node) || nodeIsOL(node) || nodeIsUL(node) )
    {
        CheckListUsage( doc, node );
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
    {
        AccessibilityCheckNode( doc, content );
    }
}